

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GreenRoomFour.cpp
# Opt level: O2

string * __thiscall
GreenRoomFour::getDescription_abi_cxx11_
          (string *__return_storage_ptr__,GreenRoomFour *this,bool longform)

{
  itemLocation iVar1;
  undefined8 in_RAX;
  ItemWrapper *this_00;
  undefined3 in_register_00000011;
  string *psVar2;
  undefined8 uStack_18;
  
  if (CONCAT31(in_register_00000011,longform) == 0) {
    uStack_18 = CONCAT44(0x18,(int)in_RAX);
    this_00 = ItemTable::getValue((this->super_Room).table,(itemType *)((long)&uStack_18 + 4));
    iVar1 = ItemWrapper::getLocation(this_00);
    if (iVar1 == HIDDEN) {
      psVar2 = (string *)&(this->super_Room).rstate2;
    }
    else {
      psVar2 = (string *)&(this->super_Room).rstate1;
    }
  }
  else {
    psVar2 = (string *)&(this->super_Room).rstate0;
    uStack_18 = in_RAX;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,psVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string GreenRoomFour::getDescription(bool longform) {
    if(longform){
        return rstate0;
    }
    if(table->getValue(KID)->getLocation() == HIDDEN) {
        return rstate2;
    }
    return rstate1;
}